

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O3

Material * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Material>
          (Structure *this,shared_ptr<Assimp::Blender::Material> *out,size_t *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Material *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  __p = (Material *)operator_new(0x6b8);
  memset(__p,0,0x5a0);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Material_008cb030;
  (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_008c4b18;
  (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  memset(__p->mtex,0,0x120);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::Blender::Material*>
            (a_Stack_30,__p);
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = __p;
  (out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }